

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *param,
          SpectrumType spectrumType,Allocator alloc)

{
  double dVar1;
  double *pdVar2;
  Allocator alloc_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uintptr_t iptr;
  RGBIlluminantSpectrum *pRVar6;
  BlackbodySpectrum *pBVar7;
  PiecewiseLinearSpectrum *pPVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  SpectrumHandle *pSVar11;
  ulong uVar12;
  size_type sVar13;
  uintptr_t uVar14;
  string *name;
  RGBColorSpace *args;
  char *fmt;
  long lVar15;
  ParsedParameter *this_00;
  int iVar16;
  ulong uVar17;
  long lVar18;
  size_type sVar19;
  ulong uVar20;
  memory_resource *pmVar21;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *v;
  char *local_260;
  long local_258;
  Allocator alloc_local;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_248;
  vector<float,_std::allocator<float>_> lambda;
  vector<float,_std::allocator<float>_> value;
  int local_204;
  polymorphic_allocator<float> local_200;
  float *local_1f8;
  ParameterDictionary *local_1f0;
  uint local_1e8;
  Allocator *local_1e0;
  ParsedParameter local_1d8;
  ParsedParameter local_108;
  Allocator *local_38;
  
  alloc_local = alloc;
  bVar5 = std::operator==(&param->type,"rgb");
  if ((bVar5) ||
     ((*(char *)(Options + 0x2d) == '\x01' && (bVar5 = std::operator==(&param->type,"color"), bVar5)
      ))) {
    value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    ._0_4_ = 3;
    uVar17 = (param->numbers).nStored;
    if (uVar17 != 0) {
      if (uVar17 % 3 != 0) {
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                   &param->name,(int *)&value);
      }
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,uVar17 / 3,(allocator_type *)&lambda);
      lVar18 = 2;
      uVar20 = 0;
      local_260 = "RGB parameter \"%s\" has negative component.";
      while( true ) {
        if (uVar17 / 3 == uVar20) {
          return __return_storage_ptr__;
        }
        pdVar2 = (param->numbers).ptr;
        lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = (float)pdVar2[lVar18];
        auVar3 = vcvtpd2ps_avx(*(undefined1 (*) [16])(pdVar2 + lVar18 + -2));
        lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)vmovlps_avx(auVar3);
        args = param->colorSpace;
        if (args == (RGBColorSpace *)0x0) {
          args = this->colorSpace;
        }
        if (auVar3._0_4_ < 0.0) break;
        auVar4 = vmovshdup_avx(auVar3);
        if ((auVar4._0_4_ < 0.0) ||
           (lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_finish._0_4_ < 0.0)) break;
        if (spectrumType == Illuminant) {
          pRVar6 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::RGBIlluminantSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                             (&alloc_local,args,(RGB *)&lambda);
          uVar12 = 0x6000000000000;
        }
        else if (spectrumType == Unbounded) {
          pRVar6 = (RGBIlluminantSpectrum *)
                   pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                             (&alloc_local,args,(RGB *)&lambda);
          uVar12 = 0x5000000000000;
        }
        else {
          if (spectrumType != Albedo) {
            LogFatal<char_const(&)[41]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                       ,0x188,"Check failed: %s",
                       (char (*) [41])"spectrumType == SpectrumType::Illuminant");
          }
          if (((1.0 < auVar3._0_4_) || (1.0 < auVar4._0_4_)) ||
             (1.0 < lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._0_4_)) {
            local_260 = "RGB parameter \"%s\" has > 1 component.";
            break;
          }
          pRVar6 = (RGBIlluminantSpectrum *)
                   pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::RGBAlbedoSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                             (&alloc_local,args,(RGB *)&lambda);
          uVar12 = 0x4000000000000;
        }
        lVar18 = lVar18 + 3;
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar20].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (ulong)pRVar6 | uVar12;
        uVar20 = uVar20 + 1;
      }
      ErrorExit<std::__cxx11::string_const&>(&param->loc,local_260,&param->name);
    }
  }
  else {
    bVar5 = std::operator==(&param->type,"blackbody");
    if (!bVar5) {
      bVar5 = std::operator==(&param->type,"spectrum");
      if ((!bVar5) || (uVar17 = (param->numbers).nStored, uVar17 == 0)) {
        bVar5 = std::operator==(&param->type,"spectrum");
        if ((!bVar5) || ((param->strings).nStored == 0)) {
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          return __return_storage_ptr__;
        }
        ParsedParameter::ParsedParameter(&local_108,param);
        local_38 = &alloc_local;
        sVar13 = (param->strings).nStored;
        if (sVar13 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,sVar13,(allocator_type *)&lambda);
        lVar18 = 0;
        for (sVar19 = 0; sVar13 != sVar19; sVar19 = sVar19 + 1) {
          name = (string *)((long)&(((param->strings).ptr)->_M_dataplus)._M_p + lVar18);
          GetNamedSpectrum((pbrt *)&local_248,name);
          if ((local_248.bits & 0xffffffffffff) == 0) {
            alloc_00.memoryResource = local_38->memoryResource;
            ResolveFilename((string *)&lambda,name);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                            *)cachedSpectra_abi_cxx11_,(key_type *)&lambda);
            if (iVar9._M_node == (_Base_ptr)(cachedSpectra_abi_cxx11_ + 8)) {
              PiecewiseLinearSpectrum::Read
                        ((PiecewiseLinearSpectrum *)&value,(string *)&lambda,alloc_00);
              if ((char)value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish == '\0') {
                uVar14 = 0;
              }
              else {
                pSVar11 = pstd::optional<pbrt::SpectrumHandle>::value
                                    ((optional<pbrt::SpectrumHandle> *)&value);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                        *)cachedSpectra_abi_cxx11_,(key_type *)&lambda);
                (pmVar10->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                ).bits = (pSVar11->
                         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                         ).bits;
                pSVar11 = pstd::optional<pbrt::SpectrumHandle>::value
                                    ((optional<pbrt::SpectrumHandle> *)&value);
                uVar14 = (pSVar11->
                         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                         ).bits;
              }
              pstd::optional<pbrt::SpectrumHandle>::~optional
                        ((optional<pbrt::SpectrumHandle> *)&value);
            }
            else {
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                      *)cachedSpectra_abi_cxx11_,(key_type *)&lambda);
              uVar14 = (pmVar10->
                       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                       ).bits;
            }
            std::__cxx11::string::~string((string *)&lambda);
            local_248.bits = uVar14;
            if ((uVar14 & 0xffffffffffff) == 0) {
              ErrorExit<std::__cxx11::string_const&>
                        (&local_108.loc,"%s: unable to read valid spectrum file",name);
            }
          }
          lVar18 = lVar18 + 0x20;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar19].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = local_248.bits;
        }
        this_00 = &local_108;
LAB_003cd233:
        ParsedParameter::~ParsedParameter(this_00);
        return __return_storage_ptr__;
      }
      if ((uVar17 & 1) == 0) {
        local_1e0 = &alloc_local;
        local_1e8 = (uint)(uVar17 >> 1);
        local_1f0 = this;
        ParsedParameter::ParsedParameter(&local_1d8,param);
        local_204 = (int)uVar17;
        uVar17 = (param->numbers).nStored;
        if (uVar17 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        uVar20 = (ulong)local_204;
        if (uVar17 % uVar20 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     &param->name,&local_204);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,(size_type)(uVar17 / uVar20),(allocator_type *)&lambda);
        local_258 = 0;
        local_1f8 = (float *)(uVar20 * 8);
        local_200.memoryResource = (memory_resource *)(uVar17 / uVar20);
        for (pmVar21 = (memory_resource *)0x0; pmVar21 < local_200.memoryResource;
            pmVar21 = (memory_resource *)((long)&pmVar21->_vptr_memory_resource + 1)) {
          pdVar2 = (param->numbers).ptr;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)
                     &lambda.super__Vector_base<float,_std::allocator<float>_>,(long)(int)local_1e8,
                     (allocator_type *)&value);
          std::vector<float,_std::allocator<float>_>::vector
                    (&value,(long)(int)local_1e8,(allocator_type *)&local_248);
          lVar15 = 0;
          iVar16 = -1;
          lVar18 = 4;
          for (uVar17 = 0; (~((int)local_1e8 >> 0x1f) & local_1e8) * 2 != uVar17;
              uVar17 = uVar17 + 2) {
            if (uVar17 == 0) {
              dVar1 = pdVar2[(long)pmVar21 * uVar20];
              uVar12 = 0;
            }
            else {
              dVar1 = *(double *)((long)pdVar2 + uVar17 * 8 + local_258);
              uVar12 = uVar17;
              if (dVar1 <= (double)*(float *)((long)lambda.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                             uVar17 * 2 + -4)) {
                local_248.bits._0_4_ = iVar16;
                ErrorExit<int,float&,double_const&>
                          (&local_1d8.loc,
                           "Spectrum description invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                           ,(int *)&local_248,
                           (float *)((long)lambda.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_start - lVar18),
                           (double *)((long)pdVar2 + (local_258 - lVar15)));
              }
            }
            lVar18 = lVar18 + -4;
            iVar16 = iVar16 + 1;
            lVar15 = lVar15 + -0x10;
            *(float *)((long)lambda.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar17 * 2) = (float)dVar1;
            *(float *)(CONCAT44(value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + uVar17 * 2) =
                 (float)(pdVar2 + (long)pmVar21 * uVar20)[uVar12 + 1];
          }
          pPVar8 = pstd::pmr::polymorphic_allocator<std::byte>::
                   new_object<pbrt::PiecewiseLinearSpectrum,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                             (local_1e0,
                              (vector<float,_std::allocator<float>_> *)
                              &lambda.super__Vector_base<float,_std::allocator<float>_>,
                              (vector<float,_std::allocator<float>_> *)
                              &value.super__Vector_base<float,_std::allocator<float>_>,local_1e0);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&value.super__Vector_base<float,_std::allocator<float>_>);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&lambda.super__Vector_base<float,_std::allocator<float>_>);
          local_258 = local_258 + (long)local_1f8;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[(long)pmVar21].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (ulong)pPVar8 | 0x3000000000000;
        }
        this_00 = &local_1d8;
        goto LAB_003cd233;
      }
      fmt = "Found odd number of values for \"%s\"";
      goto LAB_003cd2c5;
    }
    sVar13 = (param->numbers).nStored;
    if (sVar13 != 0) {
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,sVar13,(allocator_type *)&lambda);
      lVar18 = 0;
      while (bVar5 = sVar13 != 0, sVar13 = sVar13 - 1, bVar5) {
        pBVar7 = pstd::pmr::polymorphic_allocator<std::byte>::
                 new_object<pbrt::BlackbodySpectrum,double_const&>
                           (&alloc_local,(double *)((long)(param->numbers).ptr + lVar18));
        *(ulong *)((long)&(((__return_storage_ptr__->
                            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                          ).bits + lVar18) = (ulong)pBVar7 | 0x7000000000000;
        lVar18 = lVar18 + 8;
      }
      return __return_storage_ptr__;
    }
  }
  fmt = "No values provided for \"%s\".";
LAB_003cd2c5:
  ErrorExit<std::__cxx11::string_const&>(&param->loc,fmt,&param->name);
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                    ErrorExit(loc, "RGB parameter \"%s\" has negative component.",
                              param.name);
                if (spectrumType == SpectrumType::Albedo) {
                    if (rgb.r > 1 || rgb.g > 1 || rgb.b > 1)
                        ErrorExit(loc, "RGB parameter \"%s\" has > 1 component.",
                                  param.name);
                    return alloc.new_object<RGBAlbedoSpectrum>(cs, rgb);
                } else if (spectrumType == SpectrumType::Unbounded) {
                    return alloc.new_object<RGBUnboundedSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::Illuminant);
                    return alloc.new_object<RGBIlluminantSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}